

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.hpp
# Opt level: O1

void __thiscall OpenMD::Torsion::~Torsion(Torsion *this)

{
  ~Torsion(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

virtual ~Torsion() {}